

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

RgbaChannels __thiscall Imf_3_4::RgbaOutputFile::channels(RgbaOutputFile *this)

{
  RgbaChannels RVar1;
  Header *this_00;
  ChannelList *ch;
  allocator<char> local_31;
  string local_30;
  
  this_00 = OutputFile::header(this->_outputFile);
  ch = Header::channels(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  RVar1 = anon_unknown_1::rgbaChannels(ch,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return RVar1;
}

Assistant:

RgbaChannels
RgbaOutputFile::channels () const
{
    return rgbaChannels (_outputFile->header ().channels ());
}